

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

void basisu::etc_block::get_diff_subblock_colors
               (color_rgba *pDst,uint16_t packed_color5,uint32_t table_idx)

{
  long lVar1;
  uint in_EDX;
  int y3;
  int y2;
  int y1;
  int y0;
  int ib;
  int ig;
  int ir;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  int *pInten_modifer_table;
  bool in_stack_ffffffffffffffbd;
  uint16_t in_stack_ffffffffffffffbe;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int sb;
  int in_stack_ffffffffffffffc8;
  int sg;
  undefined4 in_stack_ffffffffffffffcc;
  int sr;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_24;
  undefined4 local_20;
  
  if (in_EDX < 8) {
    lVar1 = (ulong)in_EDX * 0x10;
    unpack_color5((uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  (uint32_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                  (uint32_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbd);
    sr = *(int *)(g_etc1_inten_tables + lVar1);
    color_rgba::set((color_rgba *)CONCAT44(local_20,local_24),sr,in_stack_ffffffffffffffc8,
                    in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    sg = *(int *)(g_etc1_inten_tables + lVar1 + 4);
    color_rgba::set((color_rgba *)CONCAT44(local_20,local_24),sr,sg,in_stack_ffffffffffffffc4,
                    in_stack_ffffffffffffffc0);
    sb = *(int *)(g_etc1_inten_tables + lVar1 + 8);
    color_rgba::set((color_rgba *)CONCAT44(local_20,local_24),sr,sg,sb,in_stack_ffffffffffffffc0);
    color_rgba::set((color_rgba *)CONCAT44(local_20,local_24),sr,sg,sb,
                    *(int *)(g_etc1_inten_tables + lVar1 + 0xc));
    return;
  }
  __assert_fail("table_idx < cETC1IntenModifierValues",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                ,0x217,
                "static void basisu::etc_block::get_diff_subblock_colors(color_rgba *, uint16_t, uint32_t)"
               );
}

Assistant:

void etc_block::get_diff_subblock_colors(color_rgba* pDst, uint16_t packed_color5, uint32_t table_idx)
	{
		assert(table_idx < cETC1IntenModifierValues);
		const int *pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

		uint32_t r, g, b;
		unpack_color5(r, g, b, packed_color5, true);

		const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

		const int y0 = pInten_modifer_table[0];
		pDst[0].set(ir + y0, ig + y0, ib + y0, 255);

		const int y1 = pInten_modifer_table[1];
		pDst[1].set(ir + y1, ig + y1, ib + y1, 255);

		const int y2 = pInten_modifer_table[2];
		pDst[2].set(ir + y2, ig + y2, ib + y2, 255);

		const int y3 = pInten_modifer_table[3];
		pDst[3].set(ir + y3, ig + y3, ib + y3, 255);
	}